

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absIter.c
# Opt level: O1

Gia_Man_t *
Gia_ManShrinkGla(Gia_Man_t *p,int nFrameMax,int nTimeOut,int fUsePdr,int fUseSat,int fUseBdd,
                int fVerbose)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  ulong uVar5;
  int *piVar6;
  size_t __n;
  int iVar7;
  Vec_Int_t *pVVar8;
  int *piVar9;
  long lVar10;
  long lVar11;
  Gia_Obj_t *pGVar12;
  undefined4 in_register_00000034;
  int iVar13;
  Gia_Obj_t *pGVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  bool bVar20;
  double dVar21;
  timespec ts;
  uint local_90;
  uint local_8c;
  timespec local_88;
  int local_74;
  long local_70;
  void *local_68;
  Gia_Obj_t *local_60;
  int local_58;
  int local_54;
  long local_50;
  size_t local_48;
  undefined8 local_40;
  long local_38;
  
  local_40 = CONCAT44(in_register_00000034,nFrameMax);
  local_54 = nTimeOut;
  iVar7 = clock_gettime(3,&local_88);
  if (iVar7 < 0) {
    local_50 = 1;
  }
  else {
    lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_88.tv_nsec),8);
    local_50 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_88.tv_sec * -1000000;
  }
  if (p->vCos->nSize - p->nRegs != 1) {
    __assert_fail("Gia_ManPoNum(p) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absIter.c"
                  ,0x4a,"Gia_Man_t *Gia_ManShrinkGla(Gia_Man_t *, int, int, int, int, int, int)");
  }
  pVVar8 = p->vGateClasses;
  if (pVVar8 == (Vec_Int_t *)0x0) {
    __assert_fail("p->vGateClasses != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absIter.c"
                  ,0x4b,"Gia_Man_t *Gia_ManShrinkGla(Gia_Man_t *, int, int, int, int, int, int)");
  }
  local_70 = (long)pVVar8->nSize;
  if (local_70 == 0) {
    local_68 = (void *)0x0;
  }
  else {
    local_68 = malloc(local_70 * 4);
  }
  local_48 = local_70 * 4;
  memcpy(local_68,pVVar8->pArray,local_48);
  if ((int)local_40 == 0) {
    local_58 = Gia_IterTryImprove(p,0,0);
  }
  else {
    local_58 = (int)local_40 + -1;
  }
  local_90 = 0;
  local_8c = 0;
  do {
    uVar19 = (ulong)(uint)p->nObjs;
    if (p->nObjs < 2) {
      bVar20 = true;
    }
    else {
      local_74 = 0;
      uVar18 = 1;
      lVar10 = 0xc;
      do {
        pGVar4 = p->pObjs;
        uVar5 = *(ulong *)(&pGVar4->field_0x0 + lVar10);
        uVar15 = (uint)uVar5;
        if ((uVar15 >> 0x1e & 1) == 0) {
          iVar7 = (int)uVar19;
          if ((long)iVar7 <= (long)uVar18) goto LAB_006058bf;
          iVar13 = p->vGateClasses->nSize;
          if ((long)iVar13 <= (long)uVar18) goto LAB_006058de;
          piVar9 = p->vGateClasses->pArray;
          if (piVar9[uVar18] != 0) {
            uVar1 = p->vCos->nSize;
            iVar2 = p->nRegs;
            if ((int)uVar1 <= iVar2) {
              __assert_fail("v < Gia_ManPoNum(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
            }
            if ((int)uVar1 < 1) goto LAB_006058de;
            piVar6 = p->vCos->pArray;
            iVar3 = *piVar6;
            if (((long)iVar3 < 0) || (iVar7 <= iVar3)) goto LAB_0060591c;
            local_60 = (Gia_Obj_t *)(&pGVar4->field_0x0 + lVar10);
            if (local_60 !=
                pGVar4 + iVar3 + -(ulong)((uint)*(undefined8 *)(pGVar4 + iVar3) & 0x1fffffff)) {
              pGVar14 = pGVar4 + iVar7;
              uVar16 = (uint)(uVar5 >> 0x20);
              if ((uVar5 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar15) {
                iVar3 = (int)(uVar5 & 0x1fffffff);
                pGVar12 = (Gia_Obj_t *)((long)pGVar4 + lVar10 + (ulong)(uint)(iVar3 * 4) * -3);
                if ((pGVar12 < pGVar4) || (pGVar14 <= pGVar12)) goto LAB_006058bf;
                uVar17 = (int)((long)(lVar10 + (ulong)(uint)(iVar3 << 2) * -3) >> 2) * -0x55555555;
                if (((int)uVar17 < 0) || (iVar13 <= (int)uVar17)) goto LAB_006058de;
                if (piVar9[uVar17 & 0x7fffffff] != 0) {
                  pGVar12 = (Gia_Obj_t *)
                            ((long)pGVar4 + lVar10 + (ulong)((uVar16 & 0x1fffffff) * 4) * -3);
                  if ((pGVar12 < pGVar4) || (pGVar14 <= pGVar12)) goto LAB_006058bf;
                  uVar17 = (int)((long)(lVar10 + (ulong)((uVar16 & 0x1fffffff) << 2) * -3) >> 2) *
                           -0x55555555;
                  if (((int)uVar17 < 0) || (iVar13 <= (int)uVar17)) goto LAB_006058de;
                  if (piVar9[uVar17 & 0x7fffffff] != 0) goto LAB_0060577d;
                }
              }
              if (((uVar15 & 0x9fffffff) == 0x9fffffff) &&
                 (p->vCis->nSize - iVar2 <= (int)(uVar16 & 0x1fffffff))) {
                iVar3 = p->vCis->nSize;
                if ((int)(uVar16 & 0x1fffffff) < iVar3 - iVar2) {
                  __assert_fail("Gia_ObjIsRo(p, pObj)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                                ,0x1fd,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
                }
                uVar15 = (uVar1 - iVar3) + (uVar16 & 0x1fffffff);
                if (uVar1 <= uVar15) {
LAB_006058de:
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
                }
                iVar2 = piVar6[uVar15];
                if (((long)iVar2 < 0) || (iVar7 <= iVar2)) {
LAB_0060591c:
                  __assert_fail("v >= 0 && v < p->nObjs",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                                ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
                }
                pGVar12 = pGVar4 + iVar2 +
                          -(ulong)((uint)*(undefined8 *)(pGVar4 + iVar2) & 0x1fffffff);
                if ((pGVar12 < pGVar4) || (pGVar14 <= pGVar12)) goto LAB_006058bf;
                uVar15 = (int)((long)pGVar12 - (long)pGVar4 >> 2) * -0x55555555;
                if (((int)uVar15 < 0) || (iVar13 <= (int)uVar15)) goto LAB_006058de;
                if (piVar9[uVar15 & 0x7fffffff] != 0) goto LAB_0060577d;
              }
              iVar7 = clock_gettime(3,&local_88);
              if (iVar7 < 0) {
                lVar11 = 1;
              }
              else {
                lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_88.tv_nsec),8);
                lVar11 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + local_88.tv_sec * -1000000;
              }
              printf("%5d : ",(ulong)local_8c);
              printf("Obj =%7d   ",uVar18 & 0xffffffff);
              iVar7 = local_58;
              pGVar14 = p->pObjs;
              if ((local_60 < pGVar14) || (pGVar14 + p->nObjs <= local_60)) goto LAB_006058bf;
              uVar15 = (int)((long)pGVar4 + (lVar10 - (long)pGVar14) >> 2) * -0x55555555;
              if (((int)uVar15 < 0) || (p->vGateClasses->nSize <= (int)uVar15)) {
LAB_006058fd:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
              }
              p->vGateClasses->pArray[uVar15 & 0x7fffffff] = 0;
              uVar15 = Gia_IterTryImprove(p,local_54,local_58);
              if ((int)local_40 == 0) {
                if (iVar7 < (int)uVar15) {
                  __assert_fail("iFrame <= iFrame0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absIter.c"
                                ,0x6e,
                                "Gia_Man_t *Gia_ManShrinkGla(Gia_Man_t *, int, int, int, int, int, int)"
                               );
                }
              }
              else if ((int)local_40 < (int)uVar15) {
                __assert_fail("iFrame <= nFrameMax",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absIter.c"
                              ,0x6c,
                              "Gia_Man_t *Gia_ManShrinkGla(Gia_Man_t *, int, int, int, int, int, int)"
                             );
              }
              local_38 = lVar11;
              printf("Frame =%6d   ",(ulong)uVar15);
              if ((int)uVar15 < iVar7) {
                local_60->field_0x3 = local_60->field_0x3 | 0x40;
                pGVar14 = p->pObjs;
                if ((local_60 < pGVar14) || (pGVar14 + p->nObjs <= local_60)) {
LAB_006058bf:
                  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
                }
                uVar15 = (int)((long)pGVar4 + (lVar10 - (long)pGVar14) >> 2) * -0x55555555;
                if (((int)uVar15 < 0) || (p->vGateClasses->nSize <= (int)uVar15)) goto LAB_006058fd;
                p->vGateClasses->pArray[uVar15 & 0x7fffffff] = 1;
                printf("           ");
              }
              else {
                printf("Removing   ");
                pGVar14 = p->pObjs;
                if ((local_60 < pGVar14) || (pGVar14 + p->nObjs <= local_60)) goto LAB_006058bf;
                uVar15 = (int)((long)pGVar4 + (lVar10 - (long)pGVar14) >> 2) * -0x55555555;
                if (((int)uVar15 < 0) || ((int)local_70 <= (int)uVar15)) goto LAB_006058fd;
                local_90 = local_90 + 1;
                *(undefined4 *)((long)local_68 + (ulong)(uVar15 & 0x7fffffff) * 4) = 0;
                local_74 = 1;
              }
              iVar13 = 3;
              iVar7 = clock_gettime(3,&local_88);
              if (iVar7 < 0) {
                lVar11 = -1;
              }
              else {
                lVar11 = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
              }
              lVar11 = lVar11 + local_38;
              Abc_Print(iVar13,"%s =","Time");
              Abc_Print(iVar13,"%9.2f sec\n",(double)lVar11 / 1000000.0);
              if (p->vGateClasses != (Vec_Int_t *)0x0) {
                piVar9 = p->vGateClasses->pArray;
                if (piVar9 != (int *)0x0) {
                  free(piVar9);
                  p->vGateClasses->pArray = (int *)0x0;
                }
                if (p->vGateClasses != (Vec_Int_t *)0x0) {
                  free(p->vGateClasses);
                  p->vGateClasses = (Vec_Int_t *)0x0;
                }
              }
              pVVar8 = (Vec_Int_t *)malloc(0x10);
              __n = local_48;
              iVar7 = (int)local_70;
              pVVar8->nSize = iVar7;
              pVVar8->nCap = iVar7;
              if (iVar7 == 0) {
                piVar9 = (int *)0x0;
              }
              else {
                piVar9 = (int *)malloc(local_48);
              }
              local_8c = local_8c + 1;
              pVVar8->pArray = piVar9;
              memcpy(piVar9,local_68,__n);
              p->vGateClasses = pVVar8;
            }
          }
        }
LAB_0060577d:
        uVar18 = uVar18 + 1;
        uVar19 = (ulong)p->nObjs;
        lVar10 = lVar10 + 0xc;
      } while ((long)uVar18 < (long)uVar19);
      bVar20 = local_74 == 0;
    }
    if (bVar20) {
      Gia_ManCleanMark0(p);
      if (local_68 != (void *)0x0) {
        free(local_68);
      }
      iVar7 = 0;
      printf("Tried = %d.  ",(ulong)local_8c);
      lVar10 = (long)p->vGateClasses->nSize;
      if (lVar10 < 1) {
        dVar21 = 0.0;
      }
      else {
        lVar11 = 0;
        do {
          iVar7 = iVar7 + (uint)(0 < p->vGateClasses->pArray[lVar11]);
          lVar11 = lVar11 + 1;
        } while (lVar10 != lVar11);
        dVar21 = (double)iVar7;
      }
      printf("Removed = %d. (%.2f %%)  ",((double)(int)local_90 * 100.0) / dVar21,(ulong)local_90);
      iVar13 = 3;
      iVar7 = clock_gettime(3,&local_88);
      if (iVar7 < 0) {
        lVar10 = -1;
      }
      else {
        lVar10 = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
      }
      lVar10 = lVar10 + local_50;
      Abc_Print(iVar13,"%s =","Time");
      Abc_Print(iVar13,"%9.2f sec\n",(double)lVar10 / 1000000.0);
      return (Gia_Man_t *)0x0;
    }
  } while( true );
}

Assistant:

Gia_Man_t * Gia_ManShrinkGla( Gia_Man_t * p, int nFrameMax, int nTimeOut, int fUsePdr, int fUseSat, int fUseBdd, int fVerbose )
{
    Gia_Obj_t * pObj;
    int i, iFrame0, iFrame;
    int nTotal = 0, nRemoved = 0;
    Vec_Int_t * vGScopy;
    abctime clk, clkTotal = Abc_Clock();
    assert( Gia_ManPoNum(p) == 1 );
    assert( p->vGateClasses != NULL );
    vGScopy = Vec_IntDup( p->vGateClasses );
    if ( nFrameMax == 0 )
        iFrame0 = Gia_IterTryImprove( p, 0, 0 );
    else
        iFrame0 = nFrameMax - 1;
    while ( 1 )
    {
        int fChanges = 0;
        Gia_ManForEachObj1( p, pObj, i )
        {
            if ( pObj->fMark0 )
                continue;
            if ( !Gia_ObjIsInGla(p, pObj) )
                continue;
            if ( pObj == Gia_ObjFanin0( Gia_ManPo(p, 0) ) )
                continue;
            if ( Gia_ObjIsAnd(pObj) )
            {
                if ( Gia_ObjIsInGla(p, Gia_ObjFanin0(pObj)) && Gia_ObjIsInGla(p, Gia_ObjFanin1(pObj)) )
                    continue;
            }
            if ( Gia_ObjIsRo(p, pObj) )
            {
                if ( Gia_ObjIsInGla(p, Gia_ObjFanin0(Gia_ObjRoToRi(p, pObj))) )
                    continue;
            }        
            clk = Abc_Clock();
            printf( "%5d : ", nTotal );
            printf( "Obj =%7d   ", i );
            Gia_ObjRemFromGla( p, pObj );
            iFrame = Gia_IterTryImprove( p, nTimeOut, iFrame0 );
            if ( nFrameMax )
                assert( iFrame <= nFrameMax );
            else
                assert( iFrame <= iFrame0 );
            printf( "Frame =%6d   ", iFrame );
            if ( iFrame < iFrame0 )
            {
                pObj->fMark0 = 1;
                Gia_ObjAddToGla( p, pObj );
                printf( "           " );
            }
            else
            {
                fChanges = 1;
                nRemoved++;
                printf( "Removing   " );
                Vec_IntWriteEntry( vGScopy, Gia_ObjId(p, pObj), 0 );
            }
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            nTotal++;
            // update the classes
            Vec_IntFreeP( &p->vGateClasses );
            p->vGateClasses = Vec_IntDup(vGScopy);
        }
        if ( !fChanges )
            break;
    }
    Gia_ManCleanMark0(p);
    Vec_IntFree( vGScopy );
    printf( "Tried = %d.  ",     nTotal );
    printf( "Removed = %d. (%.2f %%)  ",  nRemoved, 100.0 * nRemoved / Vec_IntCountPositive(p->vGateClasses) );
    Abc_PrintTime( 1, "Time",  Abc_Clock() - clkTotal );
    return NULL;
}